

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  nk_window *pnVar14;
  uint uVar15;
  nk_hash hash;
  int iVar16;
  nk_window *win;
  nk_window *pnVar17;
  nk_panel *pnVar18;
  uint uVar19;
  nk_window *pnVar20;
  nk_size nVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 uVar26;
  nk_rect b;
  nk_rect rect;
  float local_78;
  float fStack_74;
  
  if ((((ctx != (nk_context *)0x0) && (name != (char *)0x0)) && (title != (char *)0x0)) &&
     (ctx->current == (nk_window *)0x0)) {
    uVar15 = nk_strlen(name);
    hash = nk_murmur_hash(name,uVar15,0x40);
    win = nk_find_window(ctx,hash,name);
    if (win == (nk_window *)0x0) {
      win = (nk_window *)nk_create_window(ctx);
      if (win == (nk_window *)0x0) {
        return 0;
      }
      nk_insert_window(ctx,win,flags >> 8 & NK_INSERT_FRONT);
      (win->buffer).base = &ctx->memory;
      (win->buffer).use_clipping = 1;
      nVar21 = (ctx->memory).allocated;
      (win->buffer).begin = nVar21;
      (win->buffer).end = nVar21;
      (win->buffer).last = nVar21;
      win->flags = flags;
      local_78 = bounds.x;
      fStack_74 = bounds.y;
      (win->bounds).x = local_78;
      (win->bounds).y = fStack_74;
      (win->bounds).w = bounds.w;
      (win->bounds).h = bounds.h;
      win->name = hash;
      nVar21 = 0x3f;
      if (uVar15 < 0x3f) {
        nVar21 = (nk_size)uVar15;
      }
      nk_memcopy(win->name_string,name,nVar21);
      win->name_string[nVar21] = '\0';
      (win->popup).win = (nk_window *)0x0;
    }
    else {
      win->flags = win->flags & 0xfffffc00 | flags;
      win->seq = ctx->seq;
    }
    if (ctx->active == (nk_window *)0x0) {
      ctx->active = win;
    }
    uVar15 = win->flags;
    if ((uVar15 >> 0xc & 1) == 0) {
      fVar24 = (ctx->style).window.header.padding.y;
      fVar3 = (ctx->style).window.header.label_padding.y;
      fVar24 = fVar3 + fVar3 + fVar24 + fVar24 + ((ctx->style).font)->height;
      if ((uVar15 >> 0xe & 1) == 0) {
        fVar2 = (win->bounds).x;
        fVar8 = (win->bounds).y;
        fVar3 = (win->bounds).w;
        uVar9 = (win->bounds).h;
        fVar23 = (float)uVar9;
      }
      else {
        uVar4 = (win->bounds).x;
        uVar10 = (win->bounds).y;
        fVar3 = (win->bounds).w;
        fVar2 = (float)uVar4;
        fVar8 = (float)uVar10;
        fVar23 = fVar24;
      }
      nVar21 = (ctx->memory).allocated;
      (win->buffer).begin = nVar21;
      (win->buffer).end = nVar21;
      (win->buffer).last = nVar21;
      (win->buffer).clip = nk_null_rect;
      bVar22 = false;
      rect.y = fVar8;
      rect.x = fVar2;
      rect.h = fVar23;
      rect.w = fVar3;
      b.y = fVar8;
      b.x = fVar2;
      b.h = fVar23;
      b.w = fVar3;
      iVar16 = nk_input_has_mouse_click_down_in_rect(&ctx->input,NK_BUTTON_LEFT,b,1);
      if (iVar16 != 0) {
        bVar22 = (ctx->input).mouse.buttons[0].clicked != 0;
      }
      iVar16 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
      uVar19 = uVar15;
      if (((win != ctx->active) && (iVar16 != 0)) && ((ctx->input).mouse.buttons[0].down == 0)) {
        pnVar17 = win;
        do {
          pnVar17 = pnVar17->next;
          if (pnVar17 == (nk_window *)0x0) {
            pnVar17 = ctx->end;
            goto LAB_0010f1f6;
          }
          uVar19 = pnVar17->flags;
          if ((uVar19 >> 0xe & 1) == 0) {
            uVar26._0_4_ = (pnVar17->bounds).w;
            uVar26._4_4_ = (pnVar17->bounds).h;
          }
          else {
            uVar26 = CONCAT44(fVar24,(pnVar17->bounds).w);
          }
          uVar7 = (pnVar17->bounds).x;
          uVar13 = (pnVar17->bounds).y;
        } while ((((fVar3 + fVar2 < (float)uVar7) || ((float)uVar26 + (float)uVar7 < fVar2)) ||
                 (((~uVar19 & 0x1100) == 0 ||
                  ((fVar23 + fVar8 < (float)uVar13 ||
                   ((float)((ulong)uVar26 >> 0x20) + (float)uVar13 < fVar8)))))) &&
                ((pnVar20 = (pnVar17->popup).win, pnVar20 == (nk_window *)0x0 ||
                 ((((((uVar19 >> 0xc & 1) != 0 || ((pnVar17->popup).active == 0)) ||
                    (fVar5 = (pnVar20->bounds).x, fVar3 + fVar2 < fVar5)) ||
                   ((fVar5 + (pnVar20->bounds).w < fVar2 ||
                    (fVar5 = (pnVar20->bounds).y, fVar23 + fVar8 < fVar5)))) ||
                  (fVar5 + (pnVar20->bounds).h < fVar8))))));
      }
      if (((bVar22) && (pnVar17 = ctx->end, win != pnVar17)) && ((uVar19 & 0x100) == 0)) {
        pnVar20 = win;
        do {
          pnVar20 = pnVar20->next;
          if (pnVar20 == (nk_window *)0x0) goto LAB_0010f1f6;
          uVar19 = pnVar20->flags;
          if ((uVar19 >> 0xe & 1) == 0) {
            fVar5 = (pnVar20->bounds).w;
            uVar11 = (pnVar20->bounds).h;
            fVar25 = (float)uVar11;
          }
          else {
            fVar5 = (pnVar20->bounds).w;
            fVar25 = fVar24;
          }
          uVar6 = (pnVar20->bounds).x;
          uVar12 = (pnVar20->bounds).y;
          fVar1 = (ctx->input).mouse.pos.x;
          if ((((float)uVar6 <= fVar1) && (fVar1 <= fVar5 + (float)uVar6)) &&
             ((uVar19 >> 0xc & 1) == 0)) {
            fVar5 = (ctx->input).mouse.pos.y;
            if (((float)uVar12 <= fVar5) && (fVar5 <= fVar25 + (float)uVar12)) break;
          }
          pnVar14 = (pnVar20->popup).win;
        } while ((((pnVar14 == (nk_window *)0x0) ||
                  (((uVar19 >> 0xc & 1) != 0 || ((pnVar20->popup).active == 0)))) ||
                 (fVar5 = (pnVar14->bounds).x, fVar3 + fVar2 < fVar5)) ||
                (((fVar5 + (pnVar14->bounds).w < fVar2 ||
                  (fVar5 = (pnVar14->bounds).y, fVar23 + fVar8 < fVar5)) ||
                 (fVar5 + (pnVar14->bounds).h < fVar8))));
      }
      goto LAB_0010f22e;
    }
    ctx->current = win;
  }
  return 0;
LAB_0010f1f6:
  if (pnVar17 != win) {
    if ((uVar15 >> 8 & 1) == 0) {
      nk_remove_window(ctx,win);
      nk_insert_window(ctx,win,NK_INSERT_BACK);
      uVar15 = win->flags;
    }
    uVar15 = uVar15 & 0xfffff7ff;
    win->flags = uVar15;
    ctx->active = win;
  }
LAB_0010f22e:
  if ((ctx->end != win) && ((uVar15 & 0x100) == 0)) {
    win->flags = uVar15 | 0x800;
  }
  pnVar18 = (nk_panel *)nk_create_panel(ctx);
  win->layout = pnVar18;
  ctx->current = win;
  iVar16 = nk_panel_begin(ctx,title,NK_PANEL_WINDOW);
  win->layout->offset = &win->scrollbar;
  return iVar16;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        NK_ASSERT(win->seq != ctx->seq && "if this triggers you probably have two windows with same name!");
        win->seq = ctx->seq;
        if (!ctx->active)
            ctx->active = win;
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        return 0;
    }

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN))
    {
        int inpanel, ishovered;
        const struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        nk_start(ctx, win);
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN) || !(iter->flags & NK_WINDOW_BACKGROUND)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end) && !(iter->flags & NK_WINDOW_BACKGROUND)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        if (!iter && ctx->end != win) {
            if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, win);
                nk_insert_window(ctx, win, NK_INSERT_BACK);
            }
            win->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = win;
        }
        if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
            win->flags |= NK_WINDOW_ROM;
    }

    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset = &win->scrollbar;
    return ret;
}